

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resampler.c
# Opt level: O0

void Resmpl_ChooseResampler(RESMPL_STATE *CAA)

{
  UINT8 UVar1;
  RESMPL_STATE *CAA_local;
  
  UVar1 = CAA->resampleMode;
  if (UVar1 == '\0') {
    if (CAA->smpRateSrc < CAA->smpRateDst) {
      CAA->resampler = Resmpl_Exec_LinearUp;
    }
    else if (CAA->smpRateSrc == CAA->smpRateDst) {
      CAA->resampler = Resmpl_Exec_Copy;
    }
    else if (CAA->smpRateDst < CAA->smpRateSrc) {
      CAA->resampler = Resmpl_Exec_LinearDown;
    }
  }
  else if (UVar1 == '\x01') {
    if (CAA->smpRateSrc < CAA->smpRateDst) {
      CAA->resampler = Resmpl_Exec_Old;
    }
    else if (CAA->smpRateSrc == CAA->smpRateDst) {
      CAA->resampler = Resmpl_Exec_Copy;
    }
    else if (CAA->smpRateDst < CAA->smpRateSrc) {
      CAA->resampler = Resmpl_Exec_Old;
    }
  }
  else if (UVar1 == '\x02') {
    if (CAA->smpRateSrc < CAA->smpRateDst) {
      CAA->resampler = Resmpl_Exec_LinearUp;
    }
    else if (CAA->smpRateSrc == CAA->smpRateDst) {
      CAA->resampler = Resmpl_Exec_Copy;
    }
    else if (CAA->smpRateDst < CAA->smpRateSrc) {
      CAA->resampler = Resmpl_Exec_Old;
    }
  }
  else {
    CAA->resampler = (RESAMPLER_FUNC)0x0;
  }
  return;
}

Assistant:

static void Resmpl_ChooseResampler(RESMPL_STATE* CAA)
{
	switch(CAA->resampleMode)
	{
	case RSMODE_LINEAR:	// linear interpolation (good quality)
		if (CAA->smpRateSrc < CAA->smpRateDst)
			CAA->resampler = Resmpl_Exec_LinearUp;
		else if (CAA->smpRateSrc == CAA->smpRateDst)
			CAA->resampler = Resmpl_Exec_Copy;
		else if (CAA->smpRateSrc > CAA->smpRateDst)
			CAA->resampler = Resmpl_Exec_LinearDown;
		break;
	case RSMODE_NEAREST:	// nearest-neighbour (low quality)
		if (CAA->smpRateSrc < CAA->smpRateDst)
			CAA->resampler = Resmpl_Exec_Old;
		else if (CAA->smpRateSrc == CAA->smpRateDst)
			CAA->resampler = Resmpl_Exec_Copy;
		else if (CAA->smpRateSrc > CAA->smpRateDst)
			CAA->resampler = Resmpl_Exec_Old;
		break;
	case RSMODE_LUP_NDWN:	// nearest-neighbour downsampling, interpolation upsampling
		if (CAA->smpRateSrc < CAA->smpRateDst)
			CAA->resampler = Resmpl_Exec_LinearUp;
		else if (CAA->smpRateSrc == CAA->smpRateDst)
			CAA->resampler = Resmpl_Exec_Copy;
		else if (CAA->smpRateSrc > CAA->smpRateDst)
			CAA->resampler = Resmpl_Exec_Old;
		break;
	default:
#ifdef _DEBUG
		printf("Invalid resampler mode 0x%02X used!\n", CAA->resampleMode);
#endif
		CAA->resampler = NULL;
		break;
	}
}